

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::~RandomFloatingGenerator
          (RandomFloatingGenerator<long_double> *this)

{
  ~RandomFloatingGenerator(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

RandomFloatingGenerator<long double>::~RandomFloatingGenerator() =
            default;